

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::Raw_Tanh::forward(Raw_Tanh *this)

{
  Op *in_RDI;
  Mat *in_stack_000000c8;
  Mat *in_stack_ffffffffffffffc8;
  Mat *in_stack_ffffffffffffffd0;
  
  Op::reinit(in_RDI);
  NeuronMat::getForward((NeuronMat *)in_RDI[1]._vptr_Op);
  Mat::raw_tanh(in_stack_000000c8);
  NeuronMat::getForward(*(NeuronMat **)&in_RDI[1].forwardRound);
  Mat::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Mat::~Mat((Mat *)0x134703);
  return;
}

Assistant:

void MathOp::Raw_Tanh::forward(){
    reinit();
    *res->getForward()=a->getForward()->raw_tanh();
}